

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O2

FString * __thiscall FString::operator=(FString *this,FString *other)

{
  if (this->Chars != (char *)0x0) {
    if (other != this) {
      FStringData::Release((FStringData *)(this->Chars + -0xc));
      AttachToOther(this,other);
    }
    return this;
  }
  __assert_fail("Chars != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/zstring.cpp"
                ,0xc9,"FString &FString::operator=(const FString &)");
}

Assistant:

FString &FString::operator = (const FString &other)
{
	assert (Chars != NULL);

	if (&other != this)
	{
		int oldrefcount = Data()->RefCount < 0;
		Data()->Release();
		AttachToOther(other);
		if (oldrefcount < 0)
		{
			LockBuffer();
			Data()->RefCount = oldrefcount;
		}
	}
	return *this;
}